

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_CheckClass
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  int selector;
  char *pcVar5;
  PClass *ti;
  
  if (numret < 1) {
    return 0;
  }
  if (ret == (VMReturn *)0x0) {
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xff,
                  "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003d70c5;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d708d:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d70c5:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x100,
                  "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_003d6f8b;
    bVar2 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d70c5;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_003d708d;
LAB_003d6f8b:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003d7115;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003d7096:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d7115:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x101,
                  "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  ti = (PClass *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (ti == (PClass *)0x0) goto LAB_003d6fe4;
    bVar2 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,ti);
    if (!bVar2) {
      pcVar5 = "checktype == NULL || checktype->IsDescendantOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d7115;
    }
    bVar2 = false;
  }
  else {
    if (ti != (PClass *)0x0) goto LAB_003d7096;
LAB_003d6fe4:
    bVar2 = true;
    ti = (PClass *)0x0;
  }
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003d70f6;
    }
    selector = param[2].field_0.i;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_003d70f6:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x102,
                    "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    selector = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type != '\0') {
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003d7134;
      }
      goto LAB_003d703a;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d7134:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x103,
                  "int AF_AActor_CheckClass(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003d703a:
  iVar1 = param[3].field_0.i;
  pAVar3 = COPY_AAPTR(pAVar3,selector);
  if (bVar2 || pAVar3 == (AActor *)0x0) {
    bVar2 = false;
  }
  else if (iVar1 == 0) {
    pPVar4 = DObject::GetClass((DObject *)pAVar3);
    bVar2 = pPVar4 == ti;
  }
  else {
    bVar2 = DObject::IsKindOf((DObject *)pAVar3,ti);
  }
  VMReturn::SetInt(ret,(uint)bVar2);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckClass)
{
	if (numret > 0)
	{
		assert(ret != NULL);
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS		(checktype, AActor);
		PARAM_INT_DEF	(pick_pointer);
		PARAM_BOOL_DEF	(match_superclass);

		self = COPY_AAPTR(self, pick_pointer);
		if (self == nullptr || checktype == nullptr)
		{
			ret->SetInt(false);
		}
		else if (match_superclass)
		{
			ret->SetInt(self->IsKindOf(checktype));
		}
		else
		{
			ret->SetInt(self->GetClass() == checktype);
		}
		return 1;
	}
	return 0;
}